

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
cmGeneratorTarget::GetModuleDefinitionSources
          (cmGeneratorTarget *this,
          vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *data,string *config)

{
  bool bVar1;
  KindedSources *this_00;
  reference __x;
  SourceAndKind *s;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
  *__range2;
  KindedSources *kinded;
  string *config_local;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *data_local;
  cmGeneratorTarget *this_local;
  
  this_00 = GetKindedSources(this,config);
  __end2 = std::
           vector<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
           ::begin(&this_00->Sources);
  s = (SourceAndKind *)
      std::
      vector<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>::
      end(&this_00->Sources);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_cmGeneratorTarget::SourceAndKind_*,_std::vector<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>_>
                                *)&s);
    if (!bVar1) break;
    __x = __gnu_cxx::
          __normal_iterator<const_cmGeneratorTarget::SourceAndKind_*,_std::vector<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>_>
          ::operator*(&__end2);
    if (__x->Kind == SourceKindModuleDefinition) {
      std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::push_back
                (data,(value_type *)__x);
    }
    __gnu_cxx::
    __normal_iterator<const_cmGeneratorTarget::SourceAndKind_*,_std::vector<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void cmGeneratorTarget::GetModuleDefinitionSources(
  std::vector<cmSourceFile const*>& data, const std::string& config) const
{
  IMPLEMENT_VISIT(SourceKindModuleDefinition);
}